

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O1

Ref * __thiscall cashew::Value::operator[](Value *this,uint x)

{
  if (this->type != Array) {
    __assert_fail("isArray()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/emscripten-optimizer/simple_ast.h"
                  ,0x1ad,"Ref &cashew::Value::operator[](unsigned int)");
  }
  if ((ulong)x <
      (((this->field_1).arr)->super_ArenaVectorBase<cashew::ArrayStorage,_cashew::Ref>).usedElements
     ) {
    return (((this->field_1).arr)->super_ArenaVectorBase<cashew::ArrayStorage,_cashew::Ref>).data +
           x;
  }
  __assert_fail("index < usedElements",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/mixed_arena.h"
                ,0xbc,
                "T &ArenaVectorBase<cashew::ArrayStorage, cashew::Ref>::operator[](size_t) const [SubType = cashew::ArrayStorage, T = cashew::Ref]"
               );
}

Assistant:

Ref& operator[](unsigned x) {
    assert(isArray());
    return (*arr)[x];
  }